

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O2

void av1_get_max_min_partition_features
               (AV1_COMP *cpi,MACROBLOCK *x,int mi_row,int mi_col,float *features)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  undefined1 auVar5 [12];
  int16_t iVar6;
  int iVar7;
  int_mv iVar8;
  uint uVar9;
  undefined4 in_register_00000014;
  int this_mi_row;
  int mi_col_00;
  int ref;
  uint uVar10;
  ushort uVar11;
  bool bVar12;
  float fVar13;
  float extraout_XMM0_Db;
  float fVar14;
  float fVar17;
  undefined1 auVar15 [16];
  float fVar18;
  float fVar22;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint sse;
  float local_b8;
  int local_b4;
  float local_b0;
  uint var;
  float *local_a8;
  undefined8 local_a0;
  ulong local_98;
  MACROBLOCK *local_90;
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  undefined1 auVar16 [16];
  
  local_a0 = CONCAT44(in_register_00000014,mi_row);
  BVar1 = ((cpi->common).seq_params)->sb_size;
  local_b4 = mi_col;
  local_a8 = features;
  iVar6 = av1_dc_quant_QTX(x->qindex,0,(x->e_mbd).bd);
  iVar7 = (int)iVar6 >> ((char)(x->e_mbd).bd - 8U & 0x1f);
  local_90 = x;
  local_b8 = log1pf((float)(iVar7 * iVar7) * 0.00390625);
  bVar2 = block_size_high[BVar1];
  bVar3 = block_size_wide[BVar1];
  _local_48 = ZEXT816(0);
  local_78 = 0.0;
  fStack_74 = 0.0;
  fStack_70 = 0.0;
  fStack_6c = 3.4028235e+38;
  local_b0 = 0.0;
  local_58 = 0.0;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  _local_68 = ZEXT816(0);
  local_88 = _DAT_00425810;
  for (local_98 = 0; uVar9 = (uint)local_98, uVar9 != bVar2 >> 4;
      local_98 = (ulong)((int)local_98 + 1)) {
    iVar7 = (int)local_a0;
    mi_col_00 = local_b4;
    uVar10 = (uint)(bVar3 >> 4);
    while (bVar12 = uVar10 != 0, uVar10 = uVar10 - 1, bVar12) {
      sse = 0;
      var = 0;
      ref = 1;
      if ((cpi->rc).is_src_frame_alt_ref != 0) {
        ref = 7;
      }
      iVar8 = av1_simple_motion_search_sse_var
                        (cpi,local_90,iVar7 + uVar9 * 4,mi_col_00,BLOCK_16X16,ref,(FULLPEL_MV)0x0,1,
                         0,&sse,&var);
      fVar13 = log1pf((float)sse);
      uVar11 = iVar8.as_mv.row;
      uVar4 = (ulong)(iVar8.as_int >> 0x10) | (ulong)uVar11 << 0x10;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar4;
      auVar19 = psraw(auVar23,0xf);
      auVar20._4_2_ = auVar19._4_2_ >> 0xd;
      auVar20._6_2_ = auVar19._6_2_ >> 0xd;
      auVar20._8_2_ = auVar19._8_2_ >> 0xd;
      auVar20._10_2_ = auVar19._10_2_ >> 0xd;
      auVar20._12_2_ = auVar19._12_2_ >> 0xd;
      auVar20._14_2_ = auVar19._14_2_ >> 0xd;
      auVar20._0_2_ = (auVar19._0_2_ >> 0xd) + iVar8.as_mv.col;
      auVar20._2_2_ = (auVar19._2_2_ >> 0xd) + uVar11;
      auVar19 = psraw(auVar20,3);
      auVar16._8_6_ = 0;
      auVar16._0_8_ = uVar4;
      auVar16._14_2_ = auVar19._6_2_;
      auVar15._12_4_ = auVar16._12_4_;
      auVar15._8_2_ = 0;
      auVar15._0_8_ = uVar4;
      auVar15._10_2_ = auVar19._4_2_;
      auVar24._10_6_ = auVar15._10_6_;
      auVar24._8_2_ = 0;
      auVar24._0_8_ = uVar4;
      auVar5._4_8_ = auVar24._8_8_;
      auVar5._2_2_ = auVar19._2_2_;
      auVar5._0_2_ = uVar11;
      fVar18 = (float)(int)auVar19._0_2_;
      fVar22 = (float)(auVar5._0_4_ >> 0x10);
      fVar14 = ABS(fVar18);
      fVar17 = ABS(fVar22);
      local_b0 = local_b0 + fVar22;
      local_58 = local_58 + fVar22 * fVar22;
      local_48._0_4_ = (float)local_48._0_4_ + fVar13;
      local_48._4_4_ = (float)local_48._4_4_ + fVar18;
      fStack_40 = fStack_40 + extraout_XMM0_Db;
      fStack_3c = fStack_3c + fVar22;
      local_68._0_4_ = (float)local_68._0_4_ + fVar13 * fVar13;
      local_68._4_4_ = (float)local_68._4_4_ + fVar18 * fVar18;
      fStack_60 = fStack_60 + extraout_XMM0_Db * extraout_XMM0_Db;
      fStack_5c = fStack_5c + fVar22 * fVar22;
      auVar21._0_8_ = CONCAT44(fVar13,fVar22) & 0xffffffff7fffffff;
      auVar21._8_4_ = fVar17;
      auVar21._12_4_ = fVar17;
      local_88 = minps(auVar21,local_88);
      local_78 = (float)(~-(uint)(local_78 < fVar14) & (uint)local_78 |
                        (uint)fVar14 & -(uint)(local_78 < fVar14));
      fStack_74 = (float)(~-(uint)(fStack_74 < fVar17) & (uint)fStack_74 |
                         (uint)fVar17 & -(uint)(fStack_74 < fVar17));
      fStack_70 = (float)(~-(uint)(fStack_70 < fVar13) & (uint)fStack_70 |
                         (uint)fVar13 & -(uint)(fStack_70 < fVar13));
      fStack_6c = (float)(~-(uint)(fVar14 < fStack_6c) & (uint)fStack_6c |
                         (uint)fVar14 & -(uint)(fVar14 < fStack_6c));
      mi_col_00 = mi_col_00 + 4;
    }
  }
  auVar19._0_4_ = (float)((uint)(bVar3 >> 4) * (uint)(bVar2 >> 4));
  local_b0 = local_b0 / auVar19._0_4_;
  auVar19._4_4_ = auVar19._0_4_;
  auVar19._8_4_ = auVar19._0_4_;
  auVar19._12_4_ = auVar19._0_4_;
  auVar23 = divps(_local_48,auVar19);
  *(long *)local_a8 = auVar23._0_8_;
  local_a8[2] = local_b0;
  local_a8[3] = local_b8;
  local_a8[4] = local_78;
  local_a8[5] = fStack_74;
  local_a8[6] = fStack_70;
  local_a8[7] = fStack_6c;
  auVar24 = divps(_local_68,auVar19);
  *(long *)(local_a8 + 8) = local_88._0_8_;
  *(ulong *)(local_a8 + 10) =
       CONCAT44(auVar24._4_4_ - auVar23._4_4_ * auVar23._4_4_,
                auVar24._0_4_ - auVar23._0_4_ * auVar23._0_4_);
  local_a8[0xc] = local_58 / auVar19._0_4_ - local_b0 * local_b0;
  return;
}

Assistant:

void av1_get_max_min_partition_features(AV1_COMP *const cpi, MACROBLOCK *x,
                                        int mi_row, int mi_col,
                                        float *features) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  const BLOCK_SIZE sb_size = cm->seq_params->sb_size;

  // Currently this only allows 128X128 SB size. May extend it to 64X64 SB size.
  assert(sb_size == BLOCK_128X128);

  int f_idx = 0;

  const int dc_q = av1_dc_quant_QTX(x->qindex, 0, xd->bd) >> (xd->bd - 8);
  const float log_q_sq = log1pf((float)(dc_q * dc_q) / 256.0f);

  // Perform full-pixel single motion search in Y plane of 16x16 mbs in the sb
  float sum_mv_row_sq = 0;
  float sum_mv_row = 0;
  float min_abs_mv_row = FLT_MAX;
  float max_abs_mv_row = 0;

  float sum_mv_col_sq = 0;
  float sum_mv_col = 0;
  float min_abs_mv_col = FLT_MAX;
  float max_abs_mv_col = 0;

  float sum_log_sse_sq = 0;
  float sum_log_sse = 0;
  float min_log_sse = FLT_MAX;
  float max_log_sse = 0;

  const BLOCK_SIZE mb_size = BLOCK_16X16;
  const int mb_rows = block_size_high[sb_size] / block_size_high[mb_size];
  const int mb_cols = block_size_wide[sb_size] / block_size_wide[mb_size];
  const int mb_in_mi_size_high_log2 = mi_size_high_log2[mb_size];
  const int mb_in_mi_size_wide_log2 = mi_size_wide_log2[mb_size];

  for (int mb_row = 0; mb_row < mb_rows; mb_row++)
    for (int mb_col = 0; mb_col < mb_cols; mb_col++) {
      const int this_mi_row = mi_row + (mb_row << mb_in_mi_size_high_log2);
      const int this_mi_col = mi_col + (mb_col << mb_in_mi_size_wide_log2);
      unsigned int sse = 0;
      unsigned int var = 0;
      const FULLPEL_MV start_mv = kZeroFullMv;
      const MV_REFERENCE_FRAME ref =
          cpi->rc.is_src_frame_alt_ref ? ALTREF_FRAME : LAST_FRAME;
      const int_mv best_mv = av1_simple_motion_search_sse_var(
          cpi, x, this_mi_row, this_mi_col, mb_size, ref, start_mv, 1, 0, &sse,
          &var);

      const float mv_row = (float)(best_mv.as_mv.row / 8);
      const float mv_col = (float)(best_mv.as_mv.col / 8);
      const float log_sse = log1pf((float)sse);
      const float abs_mv_row = fabsf(mv_row);
      const float abs_mv_col = fabsf(mv_col);

      sum_mv_row_sq += mv_row * mv_row;
      sum_mv_row += mv_row;
      sum_mv_col_sq += mv_col * mv_col;
      sum_mv_col += mv_col;

      if (abs_mv_row < min_abs_mv_row) min_abs_mv_row = abs_mv_row;
      if (abs_mv_row > max_abs_mv_row) max_abs_mv_row = abs_mv_row;
      if (abs_mv_col < min_abs_mv_col) min_abs_mv_col = abs_mv_col;
      if (abs_mv_col > max_abs_mv_col) max_abs_mv_col = abs_mv_col;

      sum_log_sse_sq += log_sse * log_sse;
      sum_log_sse += log_sse;
      if (log_sse < min_log_sse) min_log_sse = log_sse;
      if (log_sse > max_log_sse) max_log_sse = log_sse;
    }
  const int blks = mb_rows * mb_cols;
  const float avg_mv_row = sum_mv_row / (float)blks;
  const float var_mv_row =
      sum_mv_row_sq / (float)blks - avg_mv_row * avg_mv_row;

  const float avg_mv_col = sum_mv_col / (float)blks;
  const float var_mv_col =
      sum_mv_col_sq / (float)blks - avg_mv_col * avg_mv_col;

  const float avg_log_sse = sum_log_sse / (float)blks;
  const float var_log_sse =
      sum_log_sse_sq / (float)blks - avg_log_sse * avg_log_sse;

  features[f_idx++] = avg_log_sse;
  features[f_idx++] = avg_mv_col;
  features[f_idx++] = avg_mv_row;
  features[f_idx++] = log_q_sq;
  features[f_idx++] = max_abs_mv_col;
  features[f_idx++] = max_abs_mv_row;
  features[f_idx++] = max_log_sse;
  features[f_idx++] = min_abs_mv_col;
  features[f_idx++] = min_abs_mv_row;
  features[f_idx++] = min_log_sse;
  features[f_idx++] = var_log_sse;
  features[f_idx++] = var_mv_col;
  features[f_idx++] = var_mv_row;

  assert(f_idx == FEATURE_SIZE_MAX_MIN_PART_PRED);
}